

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::~LogMessage(LogMessage *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  
  Flush(this);
  if (in_RDI[1] == *in_FS_OFFSET + -0x7730) {
    LogMessageData::~LogMessageData((LogMessageData *)0x121886);
    *(undefined1 *)(*in_FS_OFFSET + -0x7738) = 1;
  }
  else {
    pvVar1 = (void *)*in_RDI;
    if (pvVar1 != (void *)0x0) {
      LogMessageData::~LogMessageData((LogMessageData *)0x1218bb);
      operator_delete(pvVar1,0x7730);
    }
  }
  return;
}

Assistant:

LogMessage::~LogMessage() {
  Flush();
#ifdef GLOG_THREAD_LOCAL_STORAGE
  if (data_ == static_cast<void*>(&thread_msg_data)) {
    data_->~LogMessageData();
    thread_data_available = true;
  }
  else {
    delete allocated_;
  }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
  delete allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
}